

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ObjCHelper_ParseSimple_BasicsSuccess_Test::
~ObjCHelper_ParseSimple_BasicsSuccess_Test(ObjCHelper_ParseSimple_BasicsSuccess_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelper, ParseSimple_BasicsSuccess) {
  const std::vector<std::pair<std::string, std::vector<std::string>>> tests = {
      {"", {}},
      {"a", {"a"}},
      {"a c", {"a c"}},
      {" a c ", {"a c"}},
      {"\ta c ", {"a c"}},
      {"abc\n", {"abc"}},
      {"abc\nd f", {"abc", "d f"}},
      {"\n abc \n def \n\n", {"abc", "def"}},
  };

  for (const auto& test : tests) {
    for (int i = 0; i < kBlockSizeCount; i++) {
      io::ArrayInputStream input(test.first.data(), (int)test.first.size(),
                                 kBlockSizes[i]);
      std::string err_str;
      std::vector<std::string> lines;
      TestLineCollector collector(&lines);
      EXPECT_TRUE(ParseSimpleStream(input, "dummy", &collector, &err_str));
      EXPECT_EQ(lines, test.second);
      EXPECT_TRUE(err_str.empty());
    }
  }
}